

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O2

void StoreGray(fixed_y_t *rgb,fixed_y_t *y,int w)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < w) {
    uVar2 = (ulong)(uint)w;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    y[uVar1] = (fixed_y_t)
               ((uint)rgb[(long)(w * 2) + uVar1] * 0x127c +
                (uint)rgb[(long)w + uVar1] * 0xb717 + (uint)rgb[uVar1] * 0x366d + 0x8000 >> 0x10);
  }
  return;
}

Assistant:

static void StoreGray(const fixed_y_t* rgb, fixed_y_t* y, int w) {
  int i;
  for (i = 0; i < w; ++i) {
    y[i] = RGBToGray(rgb[0 * w + i], rgb[1 * w + i], rgb[2 * w + i]);
  }
}